

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O1

ans_fold_encode<8U> *
ans_fold_encode<8U>::create(ans_fold_encode<8U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  long *plVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  void *__s;
  size_t sVar10;
  uint64_t uVar11;
  uint largest_sym;
  long lVar12;
  ulong uVar13;
  uint64_t *puVar14;
  uint uVar15;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  ushort uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  undefined1 local_68 [16];
  pointer local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint uVar16;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  __s = operator_new(0x100000);
  local_68._8_8_ = __s;
  local_68._0_8_ = __s;
  largest_sym = 0;
  local_58 = (pointer)((long)__s + 0x100000);
  memset(__s,0,0x100000);
  local_68._8_8_ = (pointer)((long)__s + 0x100000);
  if (n != 0) {
    sVar10 = 0;
    largest_sym = 0;
    do {
      uVar16 = in_u32[sVar10];
      iVar19 = 0;
      uVar15 = uVar16;
      iVar20 = 0;
      if (0x7fff < uVar16) {
        do {
          uVar15 = uVar16 >> 8;
          iVar19 = iVar19 + 0x7f80;
          bVar4 = 0x7fffff < uVar16;
          uVar16 = uVar15;
          iVar20 = iVar19;
        } while (bVar4);
      }
      uVar15 = iVar20 + uVar15;
      plVar1 = (long *)((long)__s + (ulong)uVar15 * 8);
      *plVar1 = *plVar1 + 1;
      if (uVar15 <= largest_sym) {
        uVar15 = largest_sym;
      }
      largest_sym = uVar15;
      sVar10 = sVar10 + 1;
    } while (sVar10 != n);
  }
  adjust_freqs(&local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
               largest_sym,true,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    uVar11 = 0;
  }
  else {
    auVar23 = vpbroadcastq_avx512f();
    auVar23 = vpsrlq_avx512f(auVar23,2);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    uVar13 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar26 = vmovdqa64_avx512f(auVar28);
      auVar28 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar28,auVar24);
      auVar28 = vporq_avx512f(auVar28,auVar25);
      uVar7 = vpcmpuq_avx512f(auVar28,auVar23,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar27,auVar23,2);
      bVar9 = (byte)uVar7;
      uVar21 = CONCAT11(bVar9,bVar8);
      auVar28 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar13));
      auVar27._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar28._4_4_;
      auVar27._0_4_ = (uint)(bVar8 & 1) * auVar28._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar28._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar28._12_4_;
      auVar27._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar28._16_4_;
      auVar27._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar28._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar28._24_4_;
      auVar27._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar28._28_4_;
      auVar27._32_4_ = (uint)(bVar9 & 1) * auVar28._32_4_;
      auVar27._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar28._36_4_;
      auVar27._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar28._40_4_;
      auVar27._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar28._44_4_;
      auVar27._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar28._48_4_;
      auVar27._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar28._52_4_;
      auVar27._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar28._56_4_;
      auVar27._60_4_ = (uint)(bVar9 >> 7) * auVar28._60_4_;
      auVar28 = vpaddd_avx512f(auVar27,auVar26);
      uVar13 = uVar13 + 0x10;
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar13);
    auVar23 = vmovdqa32_avx512f(auVar28);
    auVar24._0_4_ = (uint)(bVar8 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar26._0_4_;
    bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
    auVar24._4_4_ = (uint)bVar4 * auVar23._4_4_ | (uint)!bVar4 * auVar26._4_4_;
    bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
    auVar24._8_4_ = (uint)bVar4 * auVar23._8_4_ | (uint)!bVar4 * auVar26._8_4_;
    bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
    auVar24._12_4_ = (uint)bVar4 * auVar23._12_4_ | (uint)!bVar4 * auVar26._12_4_;
    bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
    auVar24._16_4_ = (uint)bVar4 * auVar23._16_4_ | (uint)!bVar4 * auVar26._16_4_;
    bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
    auVar24._20_4_ = (uint)bVar4 * auVar23._20_4_ | (uint)!bVar4 * auVar26._20_4_;
    bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
    auVar24._24_4_ = (uint)bVar4 * auVar23._24_4_ | (uint)!bVar4 * auVar26._24_4_;
    bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
    auVar24._28_4_ = (uint)bVar4 * auVar23._28_4_ | (uint)!bVar4 * auVar26._28_4_;
    auVar24._32_4_ = (uint)(bVar9 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar26._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar24._36_4_ = (uint)bVar4 * auVar23._36_4_ | (uint)!bVar4 * auVar26._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar24._40_4_ = (uint)bVar4 * auVar23._40_4_ | (uint)!bVar4 * auVar26._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar24._44_4_ = (uint)bVar4 * auVar23._44_4_ | (uint)!bVar4 * auVar26._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar24._48_4_ = (uint)bVar4 * auVar23._48_4_ | (uint)!bVar4 * auVar26._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar24._52_4_ = (uint)bVar4 * auVar23._52_4_ | (uint)!bVar4 * auVar26._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar24._56_4_ = (uint)bVar4 * auVar23._56_4_ | (uint)!bVar4 * auVar26._56_4_;
    auVar24._60_4_ =
         (uint)(bVar9 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar26._60_4_;
    auVar22 = vextracti64x4_avx512f(auVar24,1);
    auVar23 = vpaddd_avx512f(auVar24,ZEXT3264(auVar22));
    auVar5 = vpaddd_avx(auVar23._0_16_,auVar23._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar11 = (uint64_t)auVar5._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar11;
  std::vector<enc_entry_fold,_std::allocator<enc_entry_fold>_>::resize
            (&__return_storage_ptr__->table,(ulong)(largest_sym + 1));
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 2;
    puVar14 = &((__return_storage_ptr__->table).
                super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
                super__Vector_impl_data._M_start)->sym_upper_bound;
    lVar17 = 0;
    lVar18 = 0;
    do {
      ((enc_entry_fold *)(puVar14 + -1))->freq = (uint16_t)puVar2[lVar17];
      *(uint32_t *)((long)puVar14 + -4) = (uint32_t)lVar18;
      lVar18 = lVar18 + (ulong)puVar2[lVar17];
      *puVar14 = (ulong)puVar2[lVar17] << 0x24;
      lVar17 = lVar17 + 1;
      puVar14 = puVar14 + 2;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        ans_fold_encode model;
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_fold_mapping<fidelity>(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }